

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_statemach_act(connectdata *conn)

{
  uint *puVar1;
  byte *pbVar2;
  curl_off_t *pcVar3;
  curl_usessl cVar4;
  void *pvVar5;
  pingpong *ppVar6;
  long lVar7;
  pingpong *ppVar8;
  pingpong *ppVar9;
  _Bool _Var10;
  CURLcode CVar11;
  imapstate iVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  pingpong *size;
  size_t sVar16;
  ulong uVar17;
  pingpong *pp;
  char *pcVar18;
  SessionHandle *pSVar19;
  char *pcVar20;
  char *chlg64;
  int imapcode;
  size_t nread;
  char *mech;
  size_t len;
  imapstate state1;
  char *local_90;
  CURLcode local_84;
  size_t local_80;
  char *local_78 [4];
  char *local_58;
  pingpong *local_50;
  imapstate local_44;
  size_t local_40;
  curl_socket_t local_34;
  
  local_34 = conn->sock[0];
  local_80 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
LAB_0048a4bb:
    CVar11 = CURLE_NOT_BUILT_IN;
  }
  else {
    pp = (pingpong *)&conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar11 = Curl_pp_flushsend(pp);
      return CVar11;
    }
    do {
      CVar11 = Curl_pp_readresp(local_34,pp,(int *)&local_84,&local_80);
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      if (local_84 == ~CURLE_OK) {
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      if (local_84 == CURLE_OK) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        if (local_84 != CURLE_SSH) {
          Curl_failf(conn->data,"Got unexpected imap-server response");
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        (conn->proto).imapc.authmechs = 0;
        (conn->proto).ftpc.diralloc = 0;
        (conn->proto).ftpc.ctl_valid = false;
        CVar11 = imap_sendf(conn,"CAPABILITY");
        iVar12 = IMAP_CAPABILITY;
        goto LAB_0048a749;
      case IMAP_CAPABILITY:
        pSVar19 = conn->data;
        if (local_84 == CURLE_SSH) {
          cVar4 = (pSVar19->set).use_ssl;
          if ((cVar4 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).ftpc.ctl_valid == true) {
              CVar11 = imap_sendf(conn,"STARTTLS");
              iVar12 = IMAP_STARTTLS;
              goto LAB_0048a749;
            }
            if (cVar4 != CURLUSESSL_TRY) {
              Curl_failf(pSVar19,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
        }
        else if (local_84 == CURLE_ABORTED_BY_CALLBACK) {
          pcVar20 = (pSVar19->state).buffer + 2;
          do {
            while (uVar15 = (ulong)(byte)*pcVar20, 0x20 < uVar15) {
LAB_0048a798:
              uVar17 = 0;
              while ((0x20 < (byte)uVar15 || ((0x100002601U >> (uVar15 & 0x3f) & 1) == 0))) {
                lVar7 = uVar17 + 1;
                uVar17 = uVar17 + 1;
                uVar15 = (ulong)(byte)pcVar20[lVar7];
              }
              uVar15 = uVar17;
              pcVar18 = pcVar20;
              if (uVar17 == 7) {
                if (*(int *)(pcVar20 + 3) != 0x52492d4c || *(int *)pcVar20 != 0x4c534153)
                goto LAB_0048a848;
                (conn->proto).ftpc.cwdfail = true;
                uVar15 = 7;
              }
              else if (uVar17 == 0xd) {
                if (*(long *)(pcVar20 + 5) == 0x44454c4241534944 &&
                    *(long *)pcVar20 == 0x5349444e49474f4c) {
                  (conn->proto).ftpc.cwddone = true;
                  uVar15 = 0xd;
                  goto switchD_0048a887_caseD_e;
                }
LAB_0048a848:
                if (pcVar20[4] == 0x3d && *(int *)pcVar20 == 0x48545541) {
                  pcVar18 = pcVar20 + 5;
                  uVar15 = uVar17 - 5;
                  switch(uVar17) {
                  case 9:
                    uVar15 = 4;
                    if (*(int *)pcVar18 == 0x4d4c544e) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x40;
                    }
                    break;
                  case 10:
                    if (pcVar20[9] == 0x4e && *(int *)pcVar18 == 0x49474f4c) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 1;
                      uVar15 = 5;
                    }
                    else {
                      uVar15 = 5;
                      if (pcVar20[9] == 0x4e && *(int *)pcVar18 == 0x49414c50) {
                        pbVar2 = (byte *)((long)&conn->proto + 0x78);
                        *pbVar2 = *pbVar2 | 2;
                      }
                    }
                    break;
                  case 0xb:
                    uVar15 = 6;
                    if (*(short *)(pcVar20 + 9) == 0x4950 && *(int *)pcVar18 == 0x41535347) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x10;
                    }
                    break;
                  case 0xc:
                    uVar15 = 7;
                    if (*(int *)(pcVar20 + 8) == 0x32485455 && *(int *)pcVar18 == 0x55414f58) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x80;
                    }
                    break;
                  case 0xd:
                    if (*(long *)pcVar18 == 0x35444d2d4d415243) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 4;
                      goto LAB_0048a7e2;
                    }
                    uVar15 = 8;
                    if (*(long *)pcVar18 == 0x4c414e5245545845) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x20;
                    }
                    break;
                  case 0xf:
                    uVar15 = 10;
                    if (*(short *)(pcVar20 + 0xd) == 0x3544 &&
                        *(long *)pcVar18 == 0x4d2d545345474944) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 8;
                    }
                  }
                }
              }
              else {
                if (uVar17 != 8) {
                  if (uVar17 < 6) goto switchD_0048a887_caseD_e;
                  goto LAB_0048a848;
                }
                if (*(long *)pcVar20 != 0x534c545452415453) goto LAB_0048a848;
                (conn->proto).ftpc.ctl_valid = true;
LAB_0048a7e2:
                uVar15 = 8;
              }
switchD_0048a887_caseD_e:
              pcVar20 = pcVar18 + uVar15;
            }
            if ((0x100002600U >> (uVar15 & 0x3f) & 1) == 0) {
              if (uVar15 != 0) goto LAB_0048a798;
              goto LAB_0048af4b;
            }
            pcVar20 = pcVar20 + 1;
          } while( true );
        }
        goto LAB_0048af2a;
      case IMAP_STARTTLS:
        if (local_84 == CURLE_SSH) goto LAB_0048a4bb;
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_84);
          return CURLE_USE_SSL_FAILED;
        }
LAB_0048af2a:
        CVar11 = imap_perform_authentication(conn);
        break;
      default:
        goto switchD_0048a55e_caseD_4;
      case IMAP_AUTHENTICATE_PLAIN:
        pSVar19 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 == CURLE_BAD_FUNCTION_ARGUMENT) {
          CVar11 = Curl_sasl_create_plain_message
                             (pSVar19,conn->user,conn->passwd,&local_90,(size_t *)local_78);
          goto LAB_0048aadf;
        }
        pcVar20 = "Access denied. %c";
LAB_0048acac:
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        Curl_failf(pSVar19,pcVar20,(ulong)local_84);
        CVar11 = CURLE_LOGIN_DENIED;
        goto LAB_0048acc1;
      case IMAP_AUTHENTICATE_LOGIN:
        pSVar19 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 != CURLE_BAD_FUNCTION_ARGUMENT) {
LAB_0048ab2b:
          pcVar20 = "Access denied: %d";
          goto LAB_0048acac;
        }
        CVar11 = Curl_sasl_create_login_message(pSVar19,conn->user,&local_90,(size_t *)local_78);
        if ((local_90 == (char *)0x0 || CVar11 != CURLE_OK) ||
           (CVar11 = Curl_pp_sendf(pp,"%s"), CVar11 != CURLE_OK)) goto LAB_0048acc1;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_LOGIN_PASSWD;
        goto LAB_0048ab23;
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
        pSVar19 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 != CURLE_BAD_FUNCTION_ARGUMENT) goto LAB_0048ab2b;
        CVar11 = Curl_sasl_create_login_message(pSVar19,conn->passwd,&local_90,(size_t *)local_78);
        goto LAB_0048aadf;
      case IMAP_AUTHENTICATE_CRAMMD5:
        pSVar19 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        local_58 = (char *)0x0;
        local_40 = 0;
        if (local_84 == CURLE_BAD_FUNCTION_ARGUMENT) {
          imap_get_message((pSVar19->state).buffer,&local_90);
          CVar11 = Curl_sasl_decode_cram_md5_message(local_90,local_78,&local_40);
          if (CVar11 == CURLE_OK) {
            CVar11 = Curl_sasl_create_cram_md5_message
                               (pSVar19,local_78[0],conn->user,conn->passwd,&local_58,&local_40);
            if ((local_58 != (char *)0x0 && CVar11 == CURLE_OK) &&
               (CVar11 = Curl_pp_sendf(pp,"%s"), CVar11 == CURLE_OK)) {
              iVar12 = IMAP_AUTHENTICATE_FINAL;
              goto LAB_0048af84;
            }
          }
          else {
            CVar11 = Curl_pp_sendf(pp,"%s","*");
            if (CVar11 == CURLE_OK) {
              iVar12 = IMAP_AUTHENTICATE_CANCEL;
LAB_0048af84:
              (conn->proto).imapc.state = iVar12;
              CVar11 = CURLE_OK;
            }
          }
          pcVar20 = local_58;
          if (local_78[0] != (char *)0x0) {
            (*Curl_cfree)(local_78[0]);
            local_78[0] = (char *)0x0;
            pcVar20 = local_58;
          }
          goto LAB_0048afae;
        }
LAB_0048abd9:
        local_58 = (char *)0x0;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        Curl_failf(pSVar19,"Access denied: %d",(ulong)local_84);
LAB_0048aedb:
        CVar11 = CURLE_LOGIN_DENIED;
        break;
      case IMAP_AUTHENTICATE_DIGESTMD5:
        pSVar19 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        local_58 = (char *)0x0;
        if (local_84 != CURLE_BAD_FUNCTION_ARGUMENT) goto LAB_0048abd9;
        imap_get_message((pSVar19->state).buffer,local_78);
        CVar11 = Curl_sasl_create_digest_md5_message
                           (pSVar19,local_78[0],conn->user,conn->passwd,"imap",&local_90,
                            (size_t *)&local_58);
        if (CVar11 == CURLE_OK) {
          CVar11 = Curl_pp_sendf(pp,"%s",local_90);
          pcVar20 = local_90;
          if (CVar11 == CURLE_OK) {
            iVar12 = IMAP_AUTHENTICATE_DIGESTMD5_RESP;
            goto LAB_0048af0e;
          }
        }
        else {
          pcVar20 = local_90;
          if ((CVar11 == CURLE_BAD_CONTENT_ENCODING) &&
             (CVar11 = Curl_pp_sendf(pp,"%s","*"), pcVar20 = local_90, CVar11 == CURLE_OK)) {
            iVar12 = IMAP_AUTHENTICATE_CANCEL;
LAB_0048af0e:
            (conn->proto).imapc.state = iVar12;
            CVar11 = CURLE_OK;
            pcVar20 = local_90;
          }
        }
LAB_0048afae:
        if (pcVar20 == (char *)0x0) break;
        goto LAB_0048accd;
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
        if (local_84 != CURLE_BAD_FUNCTION_ARGUMENT) {
LAB_0048b1a1:
          pSVar19 = conn->data;
          pcVar20 = "Authentication failed: %d";
LAB_0048b1ab:
          Curl_failf(pSVar19,pcVar20,(ulong)local_84);
          return CURLE_LOGIN_DENIED;
        }
        CVar11 = Curl_pp_sendf(pp,"%s","");
        iVar12 = IMAP_AUTHENTICATE_FINAL;
LAB_0048a749:
        if (CVar11 != CURLE_OK) {
          return CVar11;
        }
        (conn->proto).imapc.state = iVar12;
        goto LAB_0048af4b;
      case IMAP_AUTHENTICATE_XOAUTH2:
        pSVar19 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 != CURLE_BAD_FUNCTION_ARGUMENT) goto LAB_0048ab2b;
        CVar11 = Curl_sasl_create_xoauth2_message
                           (pSVar19,conn->user,conn->xoauth2_bearer,&local_90,(size_t *)local_78);
LAB_0048aadf:
        if ((local_90 != (char *)0x0 && CVar11 == CURLE_OK) &&
           (CVar11 = Curl_pp_sendf(pp,"%s"), CVar11 == CURLE_OK)) {
          (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
LAB_0048ab23:
          CVar11 = CURLE_OK;
        }
LAB_0048acc1:
        pcVar20 = local_90;
        if (local_90 != (char *)0x0) {
LAB_0048accd:
          (*Curl_cfree)(pcVar20);
        }
        break;
      case IMAP_AUTHENTICATE_CANCEL:
        pSVar19 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        local_58 = (char *)0x0;
        local_40 = local_40 & 0xffffffff00000000;
        local_44 = IMAP_STOP;
        puVar1 = &(conn->proto).imapc.authmechs;
        *puVar1 = *puVar1 ^ (conn->proto).imapc.authused;
        CVar11 = imap_calc_sasl_details
                           (conn,local_78,&local_90,(size_t *)&local_58,(imapstate *)&local_40,
                            &local_44);
        if (CVar11 == CURLE_OK) {
          if (local_78[0] == (char *)0x0) {
            if (((conn->proto).ftpc.cwddone != false) ||
               ((*(byte *)((long)&conn->proto + 0x7c) & 1) == 0)) {
              pcVar20 = "Authentication cancelled";
              goto LAB_0048aed4;
            }
            CVar11 = imap_perform_login(conn);
          }
          else {
            CVar11 = imap_perform_authenticate
                               (conn,local_78[0],local_90,(imapstate)local_40,local_44);
            if (local_90 != (char *)0x0) {
              (*Curl_cfree)(local_90);
            }
          }
        }
        break;
      case IMAP_AUTHENTICATE_FINAL:
        if (local_84 != CURLE_SSH) goto LAB_0048b1a1;
        goto switchD_0048a55e_caseD_4;
      case IMAP_LOGIN:
        if (local_84 != CURLE_SSH) {
          pSVar19 = conn->data;
          pcVar20 = "Access denied. %c";
          goto LAB_0048b1ab;
        }
        goto switchD_0048a55e_caseD_4;
      case IMAP_LIST:
      case IMAP_SEARCH:
        if (local_84 != CURLE_ABORTED_BY_CALLBACK) {
          CVar11 = CURLE_QUOTE_ERROR;
          goto joined_r0x0048b108;
        }
        pSVar19 = conn->data;
        pcVar20 = (pSVar19->state).buffer;
        local_50 = pp;
        sVar14 = strlen(pcVar20);
        (pSVar19->state).buffer[sVar14] = '\n';
        CVar11 = Curl_client_write(conn,1,pcVar20,sVar14 + 1);
        (pSVar19->state).buffer[sVar14] = '\0';
        pp = local_50;
        break;
      case IMAP_SELECT:
        pSVar19 = conn->data;
        if (local_84 == CURLE_SSH) {
          pvVar5 = (pSVar19->req).protop;
          if (((*(char **)((long)pvVar5 + 0x10) == (char *)0x0) ||
              (pcVar20 = (conn->proto).imapc.mailbox_uidvalidity, pcVar20 == (char *)0x0)) ||
             (iVar13 = strcmp(*(char **)((long)pvVar5 + 0x10),pcVar20), iVar13 == 0)) {
            pcVar20 = (*Curl_cstrdup)(*(char **)((long)pvVar5 + 8));
            (conn->proto).ftpc.prevpath = pcVar20;
            if (*(long *)((long)pvVar5 + 0x38) == 0) {
              if (*(long *)((long)pvVar5 + 0x30) == 0) {
                CVar11 = imap_perform_fetch(conn);
              }
              else {
                CVar11 = imap_perform_search(conn);
              }
            }
            else {
              CVar11 = imap_perform_list(conn);
            }
          }
          else {
            Curl_failf(pSVar19,"Mailbox UIDVALIDITY has changed");
            CVar11 = CURLE_REMOTE_FILE_NOT_FOUND;
          }
        }
        else {
          if (local_84 != CURLE_ABORTED_BY_CALLBACK) {
            pcVar20 = "Select failed";
LAB_0048aed4:
            Curl_failf(pSVar19,pcVar20);
            goto LAB_0048aedb;
          }
          CVar11 = CURLE_OK;
          iVar13 = __isoc99_sscanf((pSVar19->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                   local_78);
          if (iVar13 == 1) {
            pcVar20 = (conn->proto).imapc.mailbox_uidvalidity;
            if (pcVar20 != (char *)0x0) {
              (*Curl_cfree)(pcVar20);
              (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
            }
            pcVar20 = (*Curl_cstrdup)((char *)local_78);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar20;
            CVar11 = CURLE_OK;
          }
        }
        break;
      case IMAP_FETCH:
        pSVar19 = conn->data;
        if (local_84 == CURLE_ABORTED_BY_CALLBACK) {
          pcVar20 = (pSVar19->state).buffer;
          pcVar18 = (pSVar19->state).buffer;
          while( true ) {
            pcVar18 = pcVar18 + 1;
            if (pcVar18[-1] == '\0') break;
            if (pcVar18[-1] == '{') {
              size = (pingpong *)strtol(pcVar18,local_78,10);
              if ((((1 < (long)local_78[0] - (long)pcVar20) && (*local_78[0] == '}')) &&
                  (local_78[0][1] == '\r')) && (local_78[0][2] == '\0')) {
                Curl_infof(pSVar19,"Found %lu bytes to download\n",size);
                Curl_pgrsSetDownloadSize(pSVar19,(curl_off_t)size);
                if (pp->cache != (char *)0x0) {
                  local_50 = (pingpong *)(conn->proto).ftpc.pp.cache_size;
                  if (size <= local_50) {
                    local_50 = size;
                  }
                  CVar11 = Curl_client_write(conn,1,pp->cache,(size_t)local_50);
                  ppVar8 = local_50;
                  if (CVar11 != CURLE_OK) {
                    return CVar11;
                  }
                  pcVar3 = &(pSVar19->req).bytecount;
                  *pcVar3 = (long)&local_50->cache + *pcVar3;
                  Curl_infof(pSVar19,"Written %lu bytes, %lu bytes are left for transfer\n",local_50
                            );
                  ppVar9 = local_50;
                  pvVar5 = (conn->proto).generic;
                  ppVar6 = (pingpong *)(conn->proto).ftpc.pp.cache_size;
                  sVar14 = (long)ppVar6 - (long)ppVar8;
                  if (ppVar6 < ppVar8 || sVar14 == 0) {
                    if (pvVar5 != (void *)0x0) {
                      (*Curl_cfree)(pvVar5);
                      pp->cache = (char *)0x0;
                    }
                    sVar16 = 0;
                  }
                  else {
                    memmove(pvVar5,(void *)((long)pvVar5 + (long)local_50),sVar14);
                    sVar16 = (conn->proto).ftpc.pp.cache_size - (long)ppVar9;
                  }
                  (conn->proto).ftpc.pp.cache_size = sVar16;
                }
                if ((pingpong *)(pSVar19->req).bytecount == size) {
                  iVar13 = -1;
                  size = (pingpong *)0xffffffffffffffff;
                }
                else {
                  (pSVar19->req).maxdownload = (curl_off_t)size;
                  iVar13 = 0;
                }
                CVar11 = CURLE_OK;
                Curl_setup_transfer(conn,iVar13,(curl_off_t)size,false,(curl_off_t *)0x0,-1,
                                    (curl_off_t *)0x0);
                goto LAB_0048ae1a;
              }
              break;
            }
            pcVar20 = pcVar20 + 1;
          }
          Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
          CVar11 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        else {
          Curl_pgrsSetDownloadSize(pSVar19,-1);
          CVar11 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
LAB_0048ae1a:
        (conn->proto).imapc.state = IMAP_STOP;
        break;
      case IMAP_FETCH_FINAL:
        CVar11 = CURLE_FTP_WEIRD_SERVER_REPLY;
joined_r0x0048b108:
        if (local_84 != CURLE_SSH) {
          return CVar11;
        }
        goto switchD_0048a55e_caseD_4;
      case IMAP_APPEND:
        if (local_84 == CURLE_BAD_FUNCTION_ARGUMENT) {
          Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
          Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
          (conn->proto).imapc.state = IMAP_STOP;
          return CURLE_OK;
        }
        return CURLE_UPLOAD_FAILED;
      case IMAP_APPEND_FINAL:
        if (local_84 != CURLE_SSH) {
          return CURLE_UPLOAD_FAILED;
        }
switchD_0048a55e_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
        goto LAB_0048b199;
      }
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) break;
LAB_0048af4b:
      _Var10 = Curl_pp_moredata(pp);
    } while (_Var10);
LAB_0048b199:
    CVar11 = CURLE_OK;
  }
  return CVar11;
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_PLAIN:
      result = imap_state_auth_plain_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_LOGIN:
      result = imap_state_auth_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_LOGIN_PASSWD:
      result = imap_state_auth_login_password_resp(conn, imapcode,
                                                   imapc->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case IMAP_AUTHENTICATE_CRAMMD5:
      result = imap_state_auth_cram_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_DIGESTMD5:
      result = imap_state_auth_digest_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
      result = imap_state_auth_digest_resp_resp(conn, imapcode, imapc->state);
      break;
#endif

#ifdef USE_NTLM
    case IMAP_AUTHENTICATE_NTLM:
      result = imap_state_auth_ntlm_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_NTLM_TYPE2MSG:
      result = imap_state_auth_ntlm_type2msg_resp(conn, imapcode,
                                                  imapc->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case IMAP_AUTHENTICATE_GSSAPI:
      result = imap_state_auth_gssapi_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_GSSAPI_TOKEN:
      result = imap_state_auth_gssapi_token_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_GSSAPI_NO_DATA:
      result = imap_state_auth_gssapi_no_data_resp(conn, imapcode,
                                                   imapc->state);
      break;
#endif

    case IMAP_AUTHENTICATE_XOAUTH2:
      result = imap_state_auth_xoauth2_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_CANCEL:
      result = imap_state_auth_cancel_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_FINAL:
      result = imap_state_auth_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_list_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_search_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}